

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

int check_default(lys_type *type,char **value,lys_module *module,int tpdf)

{
  ly_ctx *plVar1;
  lys_tpdf *plVar2;
  lys_node_leaf *plVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  lys_tpdf *plVar7;
  lys_restr *plVar8;
  void **ppvVar9;
  int iVar10;
  int iVar11;
  LY_DATA_TYPE LVar12;
  char *pcVar13;
  char *pcVar14;
  char **__ptr;
  lys_module *plVar15;
  lys_type *plVar16;
  char cVar17;
  lys_tpdf *plVar18;
  bool bVar19;
  char *local_b0;
  char *s;
  lyd_node_leaf_list node;
  char *local_40;
  ly_ctx *local_38;
  
  local_40 = (char *)0x0;
  if (value == (char **)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0xd96,
                  "int check_default(struct lys_type *, const char **, struct lys_module *, int)");
  }
  plVar1 = module->ctx;
  node.value_str = (char *)0x0;
  node.value.binary = (char *)0x0;
  node.parent = (lyd_node *)0x0;
  node.hash = 0;
  node._52_4_ = 0;
  node.next = (lyd_node *)0x0;
  node.prev = (lyd_node *)0x0;
  node.validity = '\0';
  node._9_7_ = 0;
  node.attr = (lyd_attr *)0x0;
  s = (char *)0x0;
  node.schema = (lys_node *)0x0;
  LVar12 = type->base;
  local_38 = plVar1;
  if (LVar12 == LY_TYPE_DER) {
    iVar11 = 1;
    goto LAB_0011d3c8;
  }
  cVar17 = (char)*(undefined2 *)&module->field_0x40;
  if (tpdf != 0) {
    if (LVar12 != LY_TYPE_IDENT || cVar17 < '\0') {
      if (LVar12 != LY_TYPE_LEAFREF) goto LAB_0011d1c3;
      goto LAB_0011d1bb;
    }
    pcVar14 = *value;
    iVar11 = 0;
    if (pcVar14 == (char *)0x0) goto LAB_0011d3c8;
    pcVar13 = strchr(pcVar14,0x3a);
    if (pcVar13 != (char *)0x0) {
      pcVar14 = transform_schema2json(module,pcVar14);
LAB_0011d388:
      lydict_remove(local_38,*value);
      *value = pcVar14;
      local_40 = (char *)0x0;
      iVar10 = 0;
      goto switchD_0011d27a_caseD_3;
    }
    plVar15 = lys_main_module(module);
    iVar11 = asprintf(&local_b0,"%s:%s",plVar15->name,*value);
    if (iVar11 != -1) {
      pcVar14 = lydict_insert_zc(local_38,local_b0);
      goto LAB_0011d388;
    }
    goto LAB_0011d3a3;
  }
  if (-1 < cVar17) goto LAB_0011d1bb;
LAB_0011d1c3:
  pcVar14 = lydict_insert(plVar1,*value,0);
  local_40 = pcVar14;
  if (pcVar14 != (char *)0x0) {
    if (type->base != LY_TYPE_EMPTY) {
      plVar18 = (lys_tpdf *)0x0;
      goto switchD_0011d27a_caseD_b;
    }
    ly_vlog(plVar1,LYE_INCHILDSTMT,LY_VLOG_NONE,(void *)0x0,"default");
    ly_vlog(plVar1,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
            "The \"empty\" data type cannot have a default value.");
    iVar10 = -1;
    goto switchD_0011d27a_caseD_3;
  }
  plVar2 = type->der;
  do {
    plVar18 = plVar2;
    plVar2 = (plVar18->type).der;
    if (plVar2 == (lys_tpdf *)0x0) goto LAB_0011d1bb;
  } while (plVar18->dflt == (char *)0x0);
  iVar11 = 0;
  pcVar14 = lydict_insert(local_38,plVar18->dflt,0);
  iVar10 = 0;
  local_40 = pcVar14;
  if (pcVar14 == (char *)0x0) goto switchD_0011d27a_caseD_3;
  switch(type->base) {
  case LY_TYPE_BINARY:
  case LY_TYPE_DEC64:
  case LY_TYPE_INT8:
  case LY_TYPE_UINT8:
  case LY_TYPE_INT16:
  case LY_TYPE_UINT16:
  case LY_TYPE_INT32:
  case LY_TYPE_UINT32:
  case LY_TYPE_INT64:
  case LY_TYPE_UINT64:
    bVar19 = (type->info).bits.bit == (lys_type_bit *)0x0;
    goto LAB_0011d281;
  case LY_TYPE_BITS:
  case LY_TYPE_ENUM:
    bVar19 = (type->info).bits.count == 0;
LAB_0011d281:
    if (bVar19) goto LAB_0011d3c8;
    break;
  case LY_TYPE_BOOL:
  case LY_TYPE_EMPTY:
  case LY_TYPE_INST:
  case LY_TYPE_LEAFREF:
    goto switchD_0011d27a_caseD_3;
  case LY_TYPE_IDENT:
    plVar15 = lys_main_module(((plVar18->type).parent)->module);
    if ((plVar15->field_0x40 & 0x80) != 0) goto LAB_0011d3c8;
    module = plVar18->module;
    break;
  case LY_TYPE_STRING:
    if ((type->info).bits.bit == (lys_type_bit *)0x0) {
      bVar19 = (type->info).lref.target == (lys_node_leaf *)0x0;
      goto LAB_0011d281;
    }
    break;
  case LY_TYPE_UNION:
    break;
  default:
    ly_log(local_38,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
          );
    goto LAB_0011d3c1;
  }
switchD_0011d27a_caseD_b:
  node.value_str = (char *)0x0;
  node.value.binary = (char *)0x0;
  node.parent = (lyd_node *)0x0;
  node.hash = 0;
  node._52_4_ = 0;
  node.next = (lyd_node *)0x0;
  node.prev = (lyd_node *)0x0;
  node.validity = '\0';
  node._9_7_ = 0;
  node.attr = (lyd_attr *)0x0;
  s = (char *)0x0;
  node.schema = (lys_node *)0x0;
  node._48_8_ = lydict_insert(local_38,pcVar14,0);
  LVar12 = type->base;
  node.value.int32 = LVar12;
  if (tpdf == 0) {
    s = (char *)type->parent;
LAB_0011d451:
    if (LVar12 == LY_TYPE_LEAFREF) {
      plVar3 = (type->info).lref.target;
      if (plVar3 != (lys_node_leaf *)0x0) {
        iVar11 = check_default(&plVar3->type,&local_40,module,0);
        if (iVar11 != 0) goto LAB_0011d3c8;
        if (*value != (char *)0x0) {
          lydict_remove(local_38,*value);
          *value = local_40;
          local_40 = (char *)0x0;
        }
LAB_0011d1bb:
        iVar11 = 0;
        goto LAB_0011d3c8;
      }
      ly_vlog(local_38,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
              "Default value \"%s\" cannot be checked in an unresolved leafref.");
      iVar10 = 1;
    }
    else {
      iVar11 = 1;
      plVar16 = lyp_parse_value(type,(char **)&node.hash,(lyxml_elem *)0x0,(lyd_node_leaf_list *)&s,
                                (lyd_attr *)0x0,module,1,1,0);
      if (plVar16 == (lys_type *)0x0) {
        if ((plVar18 == (lys_tpdf *)0x0) ||
           (((type->base != LY_TYPE_ENUM && (type->base != LY_TYPE_BITS)) ||
            ((type->der->type).der == (lys_tpdf *)0x0)))) goto LAB_0011d3c8;
        ly_vlog(local_38,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                "Invalid value \"%s\" of the default statement inherited to \"%s\" from \"%s\" base type."
                ,pcVar14,type->parent->name,plVar18->name);
        iVar10 = iVar11;
      }
      else {
        if (pcVar14 == (char *)node._48_8_) goto LAB_0011d1bb;
        if (pcVar14 != *value) {
          __assert_fail("ly_strequal(dflt, *value, 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                        ,0xe4b,
                        "int check_default(struct lys_type *, const char **, struct lys_module *, int)"
                       );
        }
        lydict_remove(local_38,*value);
        *value = (char *)node._48_8_;
        node.hash = 0;
        node._52_4_ = 0;
        iVar10 = 0;
      }
    }
  }
  else {
    __ptr = (char **)calloc(1,0xd0);
    s = (char *)__ptr;
    if ((__ptr != (char **)0x0) &&
       (iVar11 = asprintf(__ptr,"typedef-%s-default",type->parent->name), iVar11 != -1)) {
      __ptr[6] = (char *)module;
      LVar12 = type->base;
      uVar4 = *(undefined4 *)&type->value_flags;
      uVar5 = *(undefined4 *)&type->ext;
      uVar6 = *(undefined4 *)((long)&type->ext + 4);
      plVar2 = type->der;
      plVar7 = type->parent;
      plVar8 = (type->info).binary.length;
      plVar3 = (type->info).lref.target;
      ppvVar9 = (type->info).str.patterns_pcre;
      __ptr[0x16] = (char *)(type->info).dec64.div;
      __ptr[0x17] = (char *)ppvVar9;
      __ptr[0x14] = (char *)plVar8;
      __ptr[0x15] = (char *)plVar3;
      __ptr[0x12] = (char *)plVar2;
      __ptr[0x13] = (char *)plVar7;
      *(LY_DATA_TYPE *)(__ptr + 0x10) = LVar12;
      *(undefined4 *)((long)__ptr + 0x84) = uVar4;
      *(undefined4 *)(__ptr + 0x11) = uVar5;
      *(undefined4 *)((long)__ptr + 0x8c) = uVar6;
      LVar12 = type->base;
      goto LAB_0011d451;
    }
LAB_0011d3a3:
    ly_log(local_38,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","check_default");
LAB_0011d3c1:
    iVar10 = -1;
  }
switchD_0011d27a_caseD_3:
  iVar11 = iVar10;
LAB_0011d3c8:
  lyd_free_value((lyd_val)node.value_str,node.value.uint32,node.value.uint64._4_1_,type,
                 (char *)node._48_8_,(lyd_val *)0x0,(LY_DATA_TYPE *)0x0,(uint8_t *)0x0);
  plVar1 = local_38;
  lydict_remove(local_38,(char *)node._48_8_);
  if (s != (char *)0x0 && tpdf != 0) {
    free(*(void **)s);
    free(s);
  }
  lydict_remove(plVar1,local_40);
  return iVar11;
}

Assistant:

static int
check_default(struct lys_type *type, const char **value, struct lys_module *module, int tpdf)
{
    struct lys_tpdf *base_tpdf = NULL;
    struct lyd_node_leaf_list node;
    const char *dflt = NULL;
    char *s;
    int ret = EXIT_SUCCESS, r;
    struct ly_ctx *ctx = module->ctx;

    assert(value);
    memset(&node, 0, sizeof node);

    if (type->base <= LY_TYPE_DER) {
        /* the type was not resolved yet, nothing to do for now */
        ret = EXIT_FAILURE;
        goto cleanup;
    } else if (!tpdf && !module->implemented) {
        /* do not check defaults in not implemented module's data */
        goto cleanup;
    } else if (tpdf && !module->implemented && type->base == LY_TYPE_IDENT) {
        /* identityrefs are checked when instantiated in data instead of typedef,
         * but in typedef the value has to be modified to include the prefix */
        if (*value) {
            if (strchr(*value, ':')) {
                dflt = transform_schema2json(module, *value);
            } else {
                /* default prefix of the module where the typedef is defined */
                if (asprintf(&s, "%s:%s", lys_main_module(module)->name, *value) == -1) {
                    LOGMEM(ctx);
                    ret = -1;
                    goto cleanup;
                }
                dflt = lydict_insert_zc(ctx, s);
            }
            lydict_remove(ctx, *value);
            *value = dflt;
            dflt = NULL;
        }
        goto cleanup;
    } else if (type->base == LY_TYPE_LEAFREF && tpdf) {
        /* leafref in typedef cannot be checked */
        goto cleanup;
    }

    dflt = lydict_insert(ctx, *value, 0);
    if (!dflt) {
        /* we do not have a new default value, so is there any to check even, in some base type? */
        for (base_tpdf = type->der; base_tpdf->type.der; base_tpdf = base_tpdf->type.der) {
            if (base_tpdf->dflt) {
                dflt = lydict_insert(ctx, base_tpdf->dflt, 0);
                break;
            }
        }

        if (!dflt) {
            /* no default value, nothing to check, all is well */
            goto cleanup;
        }

        /* so there is a default value in a base type, but can the default value be no longer valid (did we define some new restrictions)? */
        switch (type->base) {
        case LY_TYPE_IDENT:
            if (lys_main_module(base_tpdf->type.parent->module)->implemented) {
                goto cleanup;
            } else {
                /* check the default value from typedef, but use also the typedef's module
                 * due to possible searching in imported modules which is expected in
                 * typedef's module instead of module where the typedef is used */
                module = base_tpdf->module;
            }
            break;
        case LY_TYPE_INST:
        case LY_TYPE_LEAFREF:
        case LY_TYPE_BOOL:
        case LY_TYPE_EMPTY:
            /* these have no restrictions, so we would do the exact same work as the unres in the base typedef */
            goto cleanup;
        case LY_TYPE_BITS:
            /* the default value must match the restricted list of values, if the type was restricted */
            if (type->info.bits.count) {
                break;
            }
            goto cleanup;
        case LY_TYPE_ENUM:
            /* the default value must match the restricted list of values, if the type was restricted */
            if (type->info.enums.count) {
                break;
            }
            goto cleanup;
        case LY_TYPE_DEC64:
            if (type->info.dec64.range) {
                break;
            }
            goto cleanup;
        case LY_TYPE_BINARY:
            if (type->info.binary.length) {
                break;
            }
            goto cleanup;
        case LY_TYPE_INT8:
        case LY_TYPE_INT16:
        case LY_TYPE_INT32:
        case LY_TYPE_INT64:
        case LY_TYPE_UINT8:
        case LY_TYPE_UINT16:
        case LY_TYPE_UINT32:
        case LY_TYPE_UINT64:
            if (type->info.num.range) {
                break;
            }
            goto cleanup;
        case LY_TYPE_STRING:
            if (type->info.str.length || type->info.str.patterns) {
                break;
            }
            goto cleanup;
        case LY_TYPE_UNION:
            /* way too much trouble learning whether we need to check the default again, so just do it */
            break;
        default:
            LOGINT(ctx);
            ret = -1;
            goto cleanup;
        }
    } else if (type->base == LY_TYPE_EMPTY) {
        LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, "default", type->parent->name);
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "The \"empty\" data type cannot have a default value.");
        ret = -1;
        goto cleanup;
    }

    /* dummy leaf */
    memset(&node, 0, sizeof node);
    node.value_str = lydict_insert(ctx, dflt, 0);
    node.value_type = type->base;

    if (tpdf) {
        node.schema = calloc(1, sizeof (struct lys_node_leaf));
        if (!node.schema) {
            LOGMEM(ctx);
            ret = -1;
            goto cleanup;
        }
        r = asprintf((char **)&node.schema->name, "typedef-%s-default", ((struct lys_tpdf *)type->parent)->name);
        if (r == -1) {
            LOGMEM(ctx);
            ret = -1;
            goto cleanup;
        }
        node.schema->module = module;
        memcpy(&((struct lys_node_leaf *)node.schema)->type, type, sizeof *type);
    } else {
        node.schema = (struct lys_node *)type->parent;
    }

    if (type->base == LY_TYPE_LEAFREF) {
        if (!type->info.lref.target) {
            ret = EXIT_FAILURE;
            LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Default value \"%s\" cannot be checked in an unresolved leafref.",
                   dflt);
            goto cleanup;
        }
        ret = check_default(&type->info.lref.target->type, &dflt, module, 0);
        if (!ret) {
            /* adopt possibly changed default value to its canonical form */
            if (*value) {
                lydict_remove(ctx, *value);
                *value = dflt;
                dflt = NULL;
            }
        }
    } else {
        if (!lyp_parse_value(type, &node.value_str, NULL, &node, NULL, module, 1, 1, 0)) {
            /* possible forward reference */
            ret = EXIT_FAILURE;
            if (base_tpdf) {
                /* default value is defined in some base typedef */
                if ((type->base == LY_TYPE_BITS && type->der->type.der) ||
                        (type->base == LY_TYPE_ENUM && type->der->type.der)) {
                    /* we have refined bits/enums */
                    LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL,
                           "Invalid value \"%s\" of the default statement inherited to \"%s\" from \"%s\" base type.",
                           dflt, type->parent->name, base_tpdf->name);
                }
            }
        } else {
            /* success - adopt canonical form from the node into the default value */
            if (!ly_strequal(dflt, node.value_str, 1)) {
                /* this can happen only if we have non-inherited default value,
                 * inherited default values are already in canonical form */
                assert(ly_strequal(dflt, *value, 1));

                lydict_remove(ctx, *value);
                *value = node.value_str;
                node.value_str = NULL;
            }
        }
    }

cleanup:
    lyd_free_value(node.value, node.value_type, node.value_flags, type, node.value_str, NULL, NULL, NULL);
    lydict_remove(ctx, node.value_str);
    if (tpdf && node.schema) {
        free((char *)node.schema->name);
        free(node.schema);
    }
    lydict_remove(ctx, dflt);

    return ret;
}